

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O0

void aom_highbd_dc_left_predictor_16x32_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  ptrdiff_t in_RSI;
  uint16_t *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  __m128i dc;
  __m128i sum;
  __m128i sixteen;
  uint local_b8;
  uint uStackY_b4;
  uint uStackY_b0;
  uint uStackY_ac;
  undefined8 local_98;
  undefined8 uStackY_90;
  uint16_t *in_stack_ffffffffffffff78;
  undefined8 local_58;
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  int local_18;
  int iStack_14;
  int iStack_10;
  int iStack_c;
  
  local_58 = SUB168(ZEXT416(0x10),0);
  local_98 = local_58;
  uStackY_90 = 0;
  dc_sum_32(in_stack_ffffffffffffff78);
  local_18 = (int)extraout_XMM0_Qa;
  iStack_14 = (int)((ulong)extraout_XMM0_Qa >> 0x20);
  iStack_10 = (int)extraout_XMM0_Qb;
  iStack_c = (int)((ulong)extraout_XMM0_Qb >> 0x20);
  local_28 = (int)local_98;
  iStack_24 = (int)((ulong)local_98 >> 0x20);
  iStack_20 = (int)uStackY_90;
  iStack_1c = (int)((ulong)uStackY_90 >> 0x20);
  local_b8 = (uint)(local_18 + local_28) >> 5;
  uStackY_b4 = (uint)(iStack_14 + iStack_24) >> 5;
  uStackY_b0 = (uint)(iStack_10 + iStack_20) >> 5;
  uStackY_ac = (uint)(iStack_c + iStack_1c) >> 5;
  dc_store_16xh(in_RDI,in_RSI,0x20,(__m128i *)&local_b8);
  return;
}

Assistant:

void aom_highbd_dc_left_predictor_16x32_sse2(uint16_t *dst, ptrdiff_t stride,
                                             const uint16_t *above,
                                             const uint16_t *left, int bd) {
  const __m128i sixteen = _mm_cvtsi32_si128(16);
  const __m128i sum = dc_sum_32(left);
  const __m128i dc = _mm_srli_epi32(_mm_add_epi32(sum, sixteen), 5);
  (void)above;
  (void)bd;
  dc_store_16xh(dst, stride, 32, &dc);
}